

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O1

void dspl_Render(ECommand_t activeCmd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  SolStack_t *pSVar5;
  SolStack_t *pSVar6;
  size_t sVar7;
  WINDOW *pWVar8;
  char *pcVar9;
  int y;
  int y_00;
  int y_01;
  ECommand_t cmd;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ECardFace_t *pEVar15;
  Card_t card;
  Card_t card_00;
  ECardFace_t *local_58;
  
  werase(_stdscr);
  pSVar5 = tbl_GetColorStacks();
  cmd = CMD_COLOR0;
  lVar12 = 0;
  do {
    uVar3 = (uint)lVar12;
    DrawCmdLabel(cmd,uVar3 + 0x20,8);
    DrawTopCard(pSVar5,uVar3 + 0x1f,y);
    if ((ulong)activeCmd * 10 + -0x46 == lVar12) {
      DrawLabel("sel",uVar3 | 0x20,3);
    }
    lVar12 = lVar12 + 10;
    pSVar5 = pSVar5 + 1;
    cmd = cmd + CMD_EXIT;
  } while (lVar12 != 0x28);
  pSVar5 = tbl_GetPack();
  pSVar6 = tbl_GetRest();
  DrawCmdLabel(CMD_NEXT,2,8);
  DrawTopCard(pSVar5,1,y_00);
  DrawCmdLabel(CMD_PACK,0xc,8);
  DrawTopCard(pSVar6,0xb,y_01);
  if (activeCmd == CMD_PACK) {
    DrawLabel("sel",0xc,3);
  }
  pSVar5 = tbl_GetDeskStacks();
  local_58 = &pSVar5->m_cards[0].m_face;
  lVar12 = 0;
  do {
    iVar11 = (int)lVar12;
    iVar14 = iVar11 * 10 + 1;
    DrawCmdLabel((ECommand_t)(lVar12 + 0xbU),iVar11 * 10 + 2,0xc);
    if (pSVar5[lVar12].m_size == 0) {
      DrawEmptyGrid(iVar14,0xd);
    }
    pSVar6 = pSVar5 + lVar12;
    if (pSVar6->m_size != 0) {
      iVar10 = 0xd;
      uVar13 = 0;
      pEVar15 = local_58;
      do {
        uVar1 = ((Card_t *)(pEVar15 + -2))->m_type;
        uVar2 = ((Card_t *)(pEVar15 + -2))->m_color;
        card.m_color = uVar2;
        card.m_type = uVar1;
        card.m_face = *pEVar15;
        DrawFullCard(card,iVar14,iVar10);
        uVar13 = uVar13 + 1;
        iVar10 = iVar10 + 2;
        pEVar15 = pEVar15 + 3;
      } while (uVar13 < pSVar6->m_size);
    }
    if (lVar12 + 0xbU == (ulong)activeCmd) {
      DrawLabel("sel",iVar11 * 10 + 2,(int)pSVar6->m_size * 2 + 0xd);
    }
    lVar12 = lVar12 + 1;
    local_58 = local_58 + 0x9e;
  } while (lVar12 != 7);
  if (FlyingCard.m_enabled == true) {
    card_00.m_face = FlyingCard.m_card.m_face;
    card_00.m_type = FlyingCard.m_card.m_type;
    card_00.m_color = FlyingCard.m_card.m_color;
    DrawFullCard(card_00,FlyingCard.m_x,FlyingCard.m_y);
  }
  if (_stdscr == (WINDOW *)0x0) {
    iVar11 = -2;
    iVar14 = -1;
  }
  else {
    iVar11 = (int)_stdscr->_maxx;
    iVar14 = _stdscr->_maxy + 1;
  }
  wattr_on(_stdscr,0x600,0);
  if (1 < iVar11) {
    iVar10 = 1;
    do {
      iVar4 = wmove(_stdscr,iVar14 + -2,iVar10);
      if (iVar4 != -1) {
        waddch(_stdscr,0x20);
      }
      iVar10 = iVar10 + 1;
    } while (iVar11 != iVar10);
  }
  pWVar8 = _stdscr;
  iVar10 = dd_GetHighScore();
  iVar4 = tbl_GetCurrentScore();
  mvwprintw(pWVar8,iVar14 + -2,2,"High Score: %-5d   Your Score: %-5d",iVar10,iVar4);
  DrawRectangleInWindow(_stdscr,0,iVar14 + -3,iVar11,2);
  wattr_off(_stdscr,0x600,0);
  pcVar9 = Message;
  if (*Message != '\0') {
    sVar7 = strlen(Message);
    DrawLabel(pcVar9,0x21 - (int)(sVar7 >> 1),9);
  }
  wrefresh(_stdscr);
  if (activeCmd != CMD_HELP) {
    return;
  }
  pWVar8 = (WINDOW *)newwin(0x14,0x37,3,8);
  wbkgd(pWVar8,0x500);
  wattr_on(pWVar8,0x500,0);
  pcVar9 = ctrl_GetHelp();
  mvwprintw(pWVar8,1,0,"%s",pcVar9);
  DrawRectangleInWindow(pWVar8,0,0,0x36,0x13);
  wattr_off(pWVar8,0x500,0);
  wrefresh(pWVar8);
  return;
}

Assistant:

void dspl_Render(ECommand_t activeCmd)
{
  erase();
  DisplayColors(activeCmd);
  DisplayPack(activeCmd);
  DisplayDesk(activeCmd);
  DisplayFlying();
  DisplayStats();

  if (Message[0] != '\0') {
    DisplayMessage();
  }

  refresh();
  if (activeCmd == CMD_HELP) {
    DisplayHelp();
  }
}